

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O2

Interval * tcu::operator+(Interval *__return_storage_ptr__,Interval *x,Interval *y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ScopedRoundingMode p_ctx_;
  
  __return_storage_ptr__->m_hasNaN = false;
  *(undefined4 *)&__return_storage_ptr__->m_lo = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_lo + 4) = 0x7ff00000;
  *(undefined4 *)&__return_storage_ptr__->m_hi = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_hi + 4) = 0xfff00000;
  if ((x->m_lo < x->m_hi || x->m_lo == x->m_hi) && (y->m_lo < y->m_hi || y->m_lo == y->m_hi)) {
    p_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar5 = x->m_lo;
    dVar2 = y->m_lo;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar5 = dVar5 + dVar2;
    bVar1 = NAN(dVar5);
    dVar2 = -INFINITY;
    if (!bVar1) {
      dVar2 = dVar5;
    }
    dVar3 = INFINITY;
    if (!bVar1) {
      dVar3 = dVar5;
    }
    dVar6 = x->m_hi + y->m_hi;
    dVar4 = INFINITY;
    dVar5 = -INFINITY;
    if (!NAN(dVar6)) {
      dVar4 = dVar6;
      dVar5 = dVar6;
    }
    __return_storage_ptr__->m_hasNaN = bVar1 || NAN(dVar6);
    __return_storage_ptr__->m_lo =
         (double)(~-(ulong)(dVar3 <= dVar4) & (ulong)dVar4 | (ulong)dVar3 & -(ulong)(dVar3 <= dVar4)
                 );
    __return_storage_ptr__->m_hi =
         (double)(~-(ulong)(dVar5 <= dVar2) & (ulong)dVar5 | (ulong)dVar2 & -(ulong)(dVar5 <= dVar2)
                 );
    ScopedRoundingMode::~ScopedRoundingMode(&p_ctx_);
  }
  if ((x->m_hasNaN != false) || (y->m_hasNaN == true)) {
    p_ctx_.m_oldMode._0_1_ = 1;
    Interval::operator|=(__return_storage_ptr__,(Interval *)&p_ctx_);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval operator+ (const Interval& x, const Interval& y)
{
	Interval ret;

	if (!x.empty() && !y.empty())
		TCU_SET_INTERVAL_BOUNDS(ret, p, p = x.lo() + y.lo(), p = x.hi() + y.hi());
	if (x.hasNaN() || y.hasNaN())
		ret |= TCU_NAN;

	return ret;
}